

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

iterator divsufsortxx::helper::
         median5<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                   (iterator Td,iterator v1,iterator v2,iterator v3,iterator v4,iterator v5)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  pos_type pVar3;
  BitmapArray<long> *pBVar4;
  BitmapArray<long> *pBVar5;
  iterator *piVar6;
  pos_type pVar7;
  BitmapArray<long> *pBVar8;
  BitmapArray<long> *pBVar9;
  pos_type pVar10;
  pos_type pVar11;
  pos_type local_78;
  BitmapArray<long> *local_70;
  BitmapArray<long> *local_68;
  BitmapArray<long> *local_50;
  pos_type local_48;
  pos_type local_40;
  
  pVar7 = Td.pos_;
  pBVar8 = Td.array_;
  pVar10 = v2.pos_;
  pBVar9 = v2.array_;
  pVar3 = v1.pos_;
  pBVar4 = v1.array_;
  iVar1 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,pVar10);
  iVar1 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,CONCAT44(extraout_var,iVar1) + pVar7);
  local_48 = v3.pos_;
  local_50 = v3.array_;
  iVar2 = (*((v3.array_)->super_Bitmap)._vptr_Bitmap[5])(v3.array_,v3.pos_);
  iVar2 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,CONCAT44(extraout_var_01,iVar2) + pVar7);
  pVar11 = v4.pos_;
  pBVar5 = v4.array_;
  if (CONCAT44(extraout_var_02,iVar2) < CONCAT44(extraout_var_00,iVar1)) {
    local_40 = local_48;
    local_70 = local_50;
    v3.array_ = pBVar9;
    v3.pos_ = pVar10;
    local_50 = pBVar9;
    local_48 = pVar10;
  }
  else {
    local_70 = pBVar9;
    local_40 = pVar10;
  }
  iVar1 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_,v4.pos_);
  iVar1 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,CONCAT44(extraout_var_03,iVar1) + pVar7);
  iVar2 = (*((v5.array_)->super_Bitmap)._vptr_Bitmap[5])(v5.array_,v5.pos_);
  iVar2 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,CONCAT44(extraout_var_05,iVar2) + pVar7);
  if (CONCAT44(extraout_var_06,iVar2) < CONCAT44(extraout_var_04,iVar1)) {
    v4.array_ = v5.array_;
    v4.pos_ = v5.pos_;
    local_78 = pVar11;
    local_68 = pBVar5;
    pBVar5 = v5.array_;
    pVar11 = v5.pos_;
  }
  else {
    local_78 = v5.pos_;
    local_68 = v5.array_;
  }
  iVar1 = (*(local_70->super_Bitmap)._vptr_Bitmap[5])(local_70,local_40);
  iVar1 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,CONCAT44(extraout_var_07,iVar1) + pVar7);
  iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar11);
  iVar2 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,CONCAT44(extraout_var_09,iVar2) + pVar7);
  v5.array_ = local_68;
  v5.pos_ = local_78;
  if (CONCAT44(extraout_var_10,iVar2) < CONCAT44(extraout_var_08,iVar1)) {
    v4.array_ = local_70;
    v4.pos_ = local_40;
    v3.array_ = local_68;
    v3.pos_ = local_78;
    v5.array_ = local_50;
    v5.pos_ = local_48;
    local_50 = local_68;
    local_48 = local_78;
  }
  iVar1 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,pVar3);
  iVar1 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,CONCAT44(extraout_var_11,iVar1) + pVar7);
  iVar2 = (*(local_50->super_Bitmap)._vptr_Bitmap[5])(local_50,local_48);
  iVar2 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,CONCAT44(extraout_var_13,iVar2) + pVar7);
  local_78 = pVar3;
  pBVar5 = pBVar4;
  if (CONCAT44(extraout_var_14,iVar2) < CONCAT44(extraout_var_12,iVar1)) {
    local_78 = local_48;
    pBVar5 = local_50;
    v3.array_ = pBVar4;
    v3.pos_ = pVar3;
  }
  iVar1 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5);
  iVar1 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,CONCAT44(extraout_var_15,iVar1) + pVar7);
  pVar11 = v4.pos_;
  pBVar4 = v4.array_;
  iVar2 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_,v4.pos_);
  iVar2 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,CONCAT44(extraout_var_17,iVar2) + pVar7);
  if (CONCAT44(extraout_var_18,iVar2) < CONCAT44(extraout_var_16,iVar1)) {
    v3.array_ = v5.array_;
    v3.pos_ = v5.pos_;
    pBVar4 = pBVar5;
    v4.array_ = pBVar5;
    v4.pos_ = local_78;
  }
  else {
    local_78 = pVar11;
  }
  iVar1 = (*((v3.array_)->super_Bitmap)._vptr_Bitmap[5])(v3.array_,v3.pos_);
  iVar1 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,CONCAT44(extraout_var_19,iVar1) + pVar7);
  iVar2 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,local_78);
  iVar2 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,pVar7 + CONCAT44(extraout_var_21,iVar2));
  piVar6 = &v3;
  if (CONCAT44(extraout_var_22,iVar2) < CONCAT44(extraout_var_20,iVar1)) {
    piVar6 = &v4;
  }
  return *piVar6;
}

Assistant:

SAIterator_type median5(const StringIterator_type Td, SAIterator_type v1,
                        SAIterator_type v2, SAIterator_type v3,
                        SAIterator_type v4, SAIterator_type v5) {
  if (Td[*v2] > Td[*v3]) {
    std::swap(v2, v3);
  }
  if (Td[*v4] > Td[*v5]) {
    std::swap(v4, v5);
  }
  if (Td[*v2] > Td[*v4]) {
    std::swap(v2, v4);
    std::swap(v3, v5);
  }
  if (Td[*v1] > Td[*v3]) {
    std::swap(v1, v3);
  }
  if (Td[*v1] > Td[*v4]) {
    std::swap(v1, v4);
    std::swap(v3, v5);
  }
  if (Td[*v3] > Td[*v4]) {
    return v4;
  }
  return v3;
}